

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QByteArray * QUtf16::convertFromUnicode(QStringView in,State *state,DataEndianness endian)

{
  QStringView in_00;
  bool bVar1;
  char *pcVar2;
  long in_RCX;
  State *in_RDI;
  long in_FS_OFFSET;
  char *end;
  qsizetype length;
  bool writeBom;
  QByteArray *d;
  Flag in_stack_ffffffffffffff5c;
  QByteArray *in_stack_ffffffffffffff60;
  State *out;
  uint3 in_stack_ffffffffffffff88;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff8c;
  qsizetype in_stack_ffffffffffffff90;
  storage_type_conflict *in_stack_ffffffffffffff98;
  QFlagsStorageHelper<QStringConverterBase::Flag,_4> local_1c;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (uint)in_stack_ffffffffffffff88;
  out = in_RDI;
  if ((*(uint *)(in_RCX + 4) & 1) == 0) {
    local_1c.super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorage<QStringConverterBase::Flag>)
         QFlags<QStringConverterBase::Flag>::operator&
                   ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
    uVar3 = CONCAT13(bVar1,(int3)uVar3);
  }
  QStringView::size(&local_18);
  in_RDI->invalidChars = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->remainingChars = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            ((QByteArray *)CONCAT44(in_stack_ffffffffffffff8c,uVar3),(qsizetype)out,
             (Initialization)((ulong)in_RDI >> 0x20));
  pcVar2 = QByteArray::data(in_stack_ffffffffffffff60);
  in_00.m_data = in_stack_ffffffffffffff98;
  in_00.m_size = in_stack_ffffffffffffff90;
  convertFromUnicode((char *)out,in_00,in_RDI,(DataEndianness)((ulong)pcVar2 >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)out;
}

Assistant:

QByteArray QUtf16::convertFromUnicode(QStringView in, QStringConverter::State *state, DataEndianness endian)
{
    bool writeBom = !(state->internalState & HeaderDone) && state->flags & QStringConverter::Flag::WriteBom;
    qsizetype length = 2 * in.size();
    if (writeBom)
        length += 2;

    QByteArray d(length, Qt::Uninitialized);
    char *end = convertFromUnicode(d.data(), in, state, endian);
    Q_ASSERT(end - d.constData() == d.size());
    Q_UNUSED(end);
    return d;
}